

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

string * __thiscall
soul::heart::Printer::PrinterStream::getTypeDescription_abi_cxx11_
          (string *__return_storage_ptr__,PrinterStream *this,Type *type)

{
  Module *this_00;
  Type local_40;
  pool_ptr<const_soul::Module> local_28;
  
  this_00 = this->module;
  local_28.object = this_00;
  Type::removeConstIfPresent(&local_40,type);
  Program::getTypeDescriptionWithQualificationIfNeeded_abi_cxx11_
            (__return_storage_ptr__,&this_00->program,&local_28,&local_40);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_40.structure);
  return __return_storage_ptr__;
}

Assistant:

std::string getTypeDescription (const Type& type) const
        {
            return module.program.getTypeDescriptionWithQualificationIfNeeded (module, type.removeConstIfPresent());
        }